

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O3

HighsStatus
assessCosts(HighsOptions *options,HighsInt ml_col_os,HighsIndexCollection *index_collection,
           vector<double,_std::allocator<double>_> *cost,bool *has_infinite_cost,
           double infinite_cost)

{
  double dVar1;
  bool bVar2;
  bool bVar3;
  pointer piVar4;
  pointer pdVar5;
  int iVar6;
  int iVar7;
  pointer piVar8;
  int iVar9;
  uint uVar10;
  HighsInt to_k;
  HighsInt from_k;
  int local_50;
  int local_4c;
  double local_48;
  
  local_48 = infinite_cost;
  limits(index_collection,&local_4c,&local_50);
  if (local_4c <= local_50) {
    bVar2 = index_collection->is_interval_;
    bVar3 = index_collection->is_mask_;
    piVar4 = (index_collection->mask_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (cost->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    piVar8 = (index_collection->set_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start + local_4c;
    iVar7 = -1;
    iVar6 = 0;
    do {
      iVar9 = local_4c;
      if (((bVar2 | bVar3) & 1U) == 0) {
        iVar9 = *piVar8;
      }
      iVar7 = iVar7 + 1;
      if (bVar2 == false) {
        iVar7 = local_4c;
      }
      if (((bVar3 & 1U) == 0) || (piVar4[iVar9] != 0)) {
        dVar1 = pdVar5[iVar7];
        uVar10 = 0x7ff00000;
        if ((local_48 <= dVar1) || (uVar10 = 0xfff00000, dVar1 <= -local_48)) {
          iVar6 = iVar6 + 1;
          pdVar5[iVar7] = (double)((ulong)uVar10 << 0x20);
        }
      }
      local_4c = local_4c + 1;
      piVar8 = piVar8 + 1;
    } while (local_50 + 1 != local_4c);
    if (0 < iVar6) {
      *has_infinite_cost = true;
      highsLogUser(&(options->super_HighsOptionsStruct).log_options,kInfo,
                   "%d |cost| values greater than or equal to %12g are treated as Infinity\n");
    }
  }
  return kOk;
}

Assistant:

HighsStatus assessCosts(const HighsOptions& options, const HighsInt ml_col_os,
                        const HighsIndexCollection& index_collection,
                        vector<double>& cost, bool& has_infinite_cost,
                        const double infinite_cost) {
  HighsStatus return_status = HighsStatus::kOk;
  assert(ok(index_collection));
  HighsInt from_k;
  HighsInt to_k;
  limits(index_collection, from_k, to_k);
  if (from_k > to_k) return return_status;

  return_status = HighsStatus::kOk;
  // Work through the data to be assessed.
  //
  // Loop is k \in [from_k...to_k) covering the entries in the
  // interval, set or mask to be considered.
  //
  // For an interval or mask, these values of k are the columns to be
  // considered in a local sense, as well as the entries in the
  // cost data to be assessed
  //
  // For a set, these values of k are the indices in the set, from
  // which the columns to be considered in a local sense are
  // drawn. The entries in the cost data to be assessed correspond
  // to the values of k
  //
  // Adding the value of ml_col_os to local_col yields the value of
  // ml_col, being the column in a global (whole-model) sense. This is
  // necessary when assessing the costs of columns being added to a
  // model, since they are specified using an interval
  // [0...num_new_col) which must be offset by the current number of
  // columns in the model.
  //
  HighsInt local_col;
  HighsInt usr_col = -1;
  HighsInt num_infinite_cost = 0;
  for (HighsInt k = from_k; k < to_k + 1; k++) {
    if (index_collection.is_interval_ || index_collection.is_mask_) {
      local_col = k;
    } else {
      local_col = index_collection.set_[k];
    }
    if (index_collection.is_interval_) {
      usr_col++;
    } else {
      usr_col = k;
    }
    if (index_collection.is_mask_ && !index_collection.mask_[local_col])
      continue;
    if (cost[usr_col] >= infinite_cost) {
      num_infinite_cost++;
      cost[usr_col] = kHighsInf;
    } else if (cost[usr_col] <= -infinite_cost) {
      num_infinite_cost++;
      cost[usr_col] = -kHighsInf;
    }
  }
  if (num_infinite_cost > 0) {
    has_infinite_cost = true;
    highsLogUser(options.log_options, HighsLogType::kInfo,
                 "%" HIGHSINT_FORMAT
                 " |cost| values greater than or equal to %12g are treated as "
                 "Infinity\n",
                 num_infinite_cost, infinite_cost);
  }
  return return_status;
}